

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

int canconnect(_glist *x,t_object *src,int nout,t_object *sink,int nin)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = 0;
  uVar3 = 0;
  if (((sink != src) && (src != (t_object *)0x0)) && (sink != (t_object *)0x0)) {
    iVar1 = obj_ninlets(sink);
    uVar2 = uVar3;
    if (nin < iVar1) {
      iVar1 = obj_noutlets(src);
      if (nout < iVar1) {
        iVar1 = canvas_isconnected(x,src,nout,sink,nin);
        if (iVar1 == 0) {
          iVar1 = obj_issignaloutlet(src,nout);
          if (iVar1 == 0) {
            uVar2 = 1;
          }
          else {
            iVar1 = obj_issignalinlet(sink,nin);
            uVar2 = (uint)(iVar1 != 0);
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

static int canconnect(t_canvas*x, t_object*src, int nout, t_object*sink, int nin)
{
    if (!src || !sink || sink == src) /* do source and sink exist (and are not the same)?*/
        return 0;
    if (nin >= obj_ninlets(sink) || (nout >= obj_noutlets(src))) /* do the requested iolets exist? */
        return 0;
    if (canvas_isconnected(x, src, nout, sink, nin)) /* are the objects already connected? */
        return 0;
    return (!obj_issignaloutlet(src, nout) || /* are the iolets compatible? */
            obj_issignalinlet(sink, nin));
}